

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

double asl::log(double __x)

{
  bool bVar1;
  char in_AL;
  int n;
  undefined8 uVar2;
  Log *this;
  char *in_RDX;
  int iVar3;
  int iVar4;
  double __x_00;
  double dVar5;
  double extraout_XMM0_Qa;
  String message;
  va_list arg;
  String local_128;
  undefined8 local_108;
  anon_union_16_2_78e7fdac_for_String_2 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [48];
  double local_b8;
  
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  String::alloc(&local_128,100);
  local_128._len = 0;
  uVar2 = &local_128.field_2;
  if (local_128._size != 0) {
    uVar2 = local_128.field_2._str;
  }
  *(char *)uVar2 = '\0';
  local_f8 = local_e8;
  local_100 = &message.field_2;
  local_108 = 0x3000000018;
  uVar2 = &local_128.field_2;
  iVar4 = 0x10;
  if (local_128._size != 0) {
    uVar2 = local_128.field_2._str;
    iVar4 = local_128._size;
  }
  n = vsnprintf((char *)uVar2,(long)iVar4,in_RDX,&local_108);
  bVar1 = n < iVar4;
  if (n == -1 || !bVar1) {
    iVar3 = 10;
    do {
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) break;
      if (bVar1) {
        n = iVar4 * 2;
      }
      String::resize(&local_128,n,false,true);
      iVar4 = local_128._size;
      if (local_128._size == 0) {
        iVar4 = 0x10;
      }
      local_108 = 0x3000000018;
      local_100 = &message.field_2;
      local_f8 = local_e8;
      uVar2 = local_128.field_2._str;
      if (local_128._size == 0) {
        uVar2 = &local_128.field_2;
      }
      n = vsnprintf((char *)uVar2,(long)iVar4,in_RDX,&local_108);
      bVar1 = n < iVar4;
    } while (n == -1 || !bVar1);
  }
  local_128._len = n;
  this = Singleton<asl::Log>::instance();
  dVar5 = Log::log(this,__x_00);
  if (local_128._size != 0) {
    free(local_128.field_2._str);
    dVar5 = extraout_XMM0_Qa;
  }
  return dVar5;
}

Assistant:

void log(const String& cat, Log::Level level, ASL_PRINTF_W1 const char* fmt, ...)
{
	String message(100, 0);
	va_list arg;
	va_start(arg, fmt);
	int i = 0, n = 0;
	int space = message.cap();
	while (((n = vsnprintf(message.data(), space, fmt, arg)) == -1 || n >= space) && ++i < 10)
	{
		message.resize((n >= space) ? n : 2 * space, false);
		space = message.cap();
		va_end(arg);
		va_start(arg, fmt);
	}
	va_end(arg);
	message.fix(n);

	Log::instance()->log(cat, level, message);
}